

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

string * __thiscall
cxxopts::values::abstract_value<bool>::get_default_value_abi_cxx11_(abstract_value<bool> *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x38));
  return in_RDI;
}

Assistant:

std::string
            get_default_value() const
            {
                return m_default_value;
            }